

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O1

void __thiscall
TPZAnalysis::SetStructuralMatrix(TPZAnalysis *this,TPZAutoPointer<TPZStructMatrix> *strmatrix)

{
  TPZStructMatrix *pTVar1;
  TPZAutoPointer<TPZStructMatrix> local_18;
  
  pTVar1 = (TPZStructMatrix *)(**(code **)(*(long *)strmatrix->fRef->fPointer + 0x48))();
  local_18.fRef = (TPZReference *)operator_new(0x10);
  ((local_18.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_18.fRef)->fPointer = pTVar1;
  LOCK();
  ((local_18.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZAutoPointer<TPZStructMatrix>::operator=(&this->fStructMatrix,&local_18);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer(&local_18);
  return;
}

Assistant:

void TPZAnalysis::SetStructuralMatrix(TPZAutoPointer<TPZStructMatrix> strmatrix){
	fStructMatrix = TPZAutoPointer<TPZStructMatrix>(strmatrix->Clone());
// #ifdef PZDEBUG
    auto* tmp =
        dynamic_cast<TPZStructMatrixT<STATE> *>((strmatrix.operator->()));
    if(tmp){//real struct matrix
        if(fCompMesh && fCompMesh->GetSolType() == EReal){
            return;
        }
    }else{//complex struct matrix
        if(fCompMesh && fCompMesh->GetSolType() == EComplex){
            return;
        }
    }
// #endif
}